

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar.c
# Opt level: O0

void ossl_curve448_scalar_encode(uchar *ser,curve448_scalar_s *s)

{
  uint k;
  uint j;
  uint i;
  curve448_scalar_s *s_local;
  uchar *ser_local;
  
  k = 0;
  for (i = 0; i < 7; i = i + 1) {
    for (j = 0; j < 8; j = j + 1) {
      ser[k] = (uchar)(s->limb[i] >> ((byte)(j << 3) & 0x3f));
      k = k + 1;
    }
  }
  return;
}

Assistant:

void
ossl_curve448_scalar_encode(unsigned char ser[C448_SCALAR_BYTES],
                            const curve448_scalar_t s)
{
    unsigned int i, j, k = 0;

    for (i = 0; i < C448_SCALAR_LIMBS; i++) {
        for (j = 0; j < sizeof(c448_word_t); j++, k++)
            ser[k] = s->limb[i] >> (8 * j);
    }
}